

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O2

bool __thiscall
ON_Curve::IsContinuous
          (ON_Curve *this,continuity desired_continuity,double t,int *hint,double point_tolerance,
          double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  ON_3dVector Km;
  ON_3dVector Km_00;
  ON_3dVector Kp;
  ON_3dVector Kp_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  continuity cVar4;
  double *pdVar5;
  ON_3dVector *__return_storage_ptr__;
  double dVar6;
  double local_148;
  double local_140;
  ON_3dPoint Pm;
  ON_3dPoint Pp;
  ON_3dVector D2m;
  ON_3dVector D1m;
  ON_3dVector D2p;
  ON_3dVector D1p;
  ON_Interval domain;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_3dVector local_40;
  
  dVar6 = point_tolerance;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  domain.m_t[1] = dVar6;
  bVar1 = ON_Interval::IsIncreasing(&domain);
  if (!bVar1) {
    return true;
  }
  pdVar5 = ON_Interval::operator[](&domain,0);
  if (desired_continuity - C0_locus_continuous < 5) {
    if (t <= *pdVar5) {
      return true;
    }
    pdVar5 = ON_Interval::operator[](&domain,1);
    if ((*pdVar5 != t) || (NAN(*pdVar5) || NAN(t))) goto LAB_0044b203;
    iVar3 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(this);
    if ((char)iVar3 == '\0') {
      return false;
    }
    if (desired_continuity == C0_locus_continuous) {
      return true;
    }
    pdVar5 = ON_Interval::operator[](&domain,0);
    local_148 = *pdVar5;
    pdVar5 = ON_Interval::operator[](&domain,1);
    local_140 = *pdVar5;
    bVar1 = true;
  }
  else {
    if (t <= *pdVar5) {
      return true;
    }
    pdVar5 = ON_Interval::operator[](&domain,1);
    if (*pdVar5 <= t) {
      return true;
    }
LAB_0044b203:
    bVar1 = false;
    local_148 = t;
    local_140 = t;
  }
  cVar4 = ON::ParametricContinuity(desired_continuity);
  switch(cVar4) {
  case C0_continuous:
    bVar2 = EvPoint(this,local_140,&Pm,-1,hint);
    if (!bVar2) {
      return false;
    }
    bVar2 = EvPoint(this,local_148,&Pp,1,hint);
    if (!bVar2) {
      return false;
    }
    if (bVar1) {
      Pm.z = Pp.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    __return_storage_ptr__ = &D1m;
    ON_3dPoint::operator-(__return_storage_ptr__,&Pm,&Pp);
    d2_tolerance = point_tolerance;
    break;
  case C1_continuous:
    bVar2 = Ev1Der(this,local_140,&Pm,&D1m,-1,hint);
    if (!bVar2) {
      return false;
    }
    bVar2 = Ev1Der(this,local_148,&Pp,&D1p,1,hint);
    if (!bVar2) {
      return false;
    }
    if (bVar1) {
      Pm.z = Pp.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&D2m,&Pm,&Pp);
    bVar1 = ON_3dVector::IsTiny(&D2m,point_tolerance);
    if (!bVar1) {
      return false;
    }
    __return_storage_ptr__ = &D2p;
    ON_3dVector::operator-(__return_storage_ptr__,&D1m,&D1p);
    d2_tolerance = d1_tolerance;
    break;
  case C2_continuous:
    bVar2 = Ev2Der(this,local_140,&Pm,&D1m,&D2m,-1,hint);
    if (!bVar2) {
      return false;
    }
    bVar2 = Ev2Der(this,local_148,&Pp,&D1p,&D2p,1,hint);
    if (!bVar2) {
      return false;
    }
    if (bVar1) {
      Pm.z = Pp.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&local_70,&Pm,&Pp);
    bVar1 = ON_3dVector::IsTiny(&local_70,point_tolerance);
    if (!bVar1) {
      return false;
    }
    ON_3dVector::operator-(&local_40,&D1m,&D1p);
    bVar1 = ON_3dVector::IsTiny(&local_40,d1_tolerance);
    if (!bVar1) {
      return false;
    }
    __return_storage_ptr__ = &local_58;
    ON_3dVector::operator-(__return_storage_ptr__,&D2m,&D2p);
    break;
  case G1_continuous:
    bVar2 = EvTangent(this,local_140,&Pm,&D1m,-1,hint);
    if (!bVar2) {
      return false;
    }
    bVar2 = EvTangent(this,local_148,&Pp,&D1p,1,hint);
    if (!bVar2) {
      return false;
    }
    if (bVar1) {
      Pm.z = Pp.z;
      Pm.x = Pp.x;
      Pm.y = Pp.y;
    }
    ON_3dPoint::operator-(&D2m,&Pm,&Pp);
    bVar1 = ON_3dVector::IsTiny(&D2m,point_tolerance);
    if (!bVar1) {
      return false;
    }
    dVar6 = ON_3dVector::operator*(&D1m,&D1p);
    if (dVar6 < cos_angle_tolerance) {
      return false;
    }
    return true;
  case G2_continuous:
  case Gsmooth_continuous:
    bVar2 = EvCurvature(this,local_140,&Pm,&D1m,&D2m,-1,hint);
    if (!bVar2) {
      return false;
    }
    bVar2 = EvCurvature(this,local_148,&Pp,&D1p,&D2p,1,hint);
    if (!bVar2) {
      return false;
    }
    if (!bVar1) {
      ON_3dPoint::operator-(&local_70,&Pm,&Pp);
      bVar1 = ON_3dVector::IsTiny(&local_70,point_tolerance);
      if (!bVar1) {
        return false;
      }
    }
    dVar6 = ON_3dVector::operator*(&D1m,&D1p);
    if (dVar6 < cos_angle_tolerance) {
      return false;
    }
    if (cVar4 == Gsmooth_continuous) {
      Km.y = D2m.y;
      Km.x = D2m.x;
      Km.z = D2m.z;
      Kp.y = D2p.y;
      Kp.x = D2p.x;
      Kp.z = D2p.z;
      bVar1 = ON_IsGsmoothCurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance);
    }
    else {
      Km_00.y = D2m.y;
      Km_00.x = D2m.x;
      Km_00.z = D2m.z;
      Kp_00.y = D2p.y;
      Kp_00.x = D2p.x;
      Kp_00.z = D2p.z;
      bVar1 = ON_IsG2CurvatureContinuous(Km_00,Kp_00,cos_angle_tolerance,curvature_tolerance);
    }
    goto LAB_0044b5b1;
  default:
    goto LAB_0044b680;
  }
  bVar1 = ON_3dVector::IsTiny(__return_storage_ptr__,d2_tolerance);
LAB_0044b5b1:
  if (bVar1 == false) {
    return false;
  }
LAB_0044b680:
  return true;
}

Assistant:

bool ON_Curve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
  {
    return true;
  }

  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;

  bool bIsClosed = false;

  // 20 March 2003 Dale Lear
  //     I added this preable to handle the new
  //     locus continuity values.
  double t0 = t;
  double t1 = t;
  switch(desired_continuity)
  {
  case ON::continuity::C0_locus_continuous:
  case ON::continuity::C1_locus_continuous:
  case ON::continuity::C2_locus_continuous:
  case ON::continuity::G1_locus_continuous:
  case ON::continuity::G2_locus_continuous:
    if ( t <= domain[0] )
    {
      // By convention - see comments by ON::continuity enum.
      return true;
    }
    if ( t == domain[1] )
    {
      if ( !IsClosed() )
      {
        // open curves are not locus continuous at the end parameter
        // see comments by ON::continuity enum
        return false;
      }
      else 
      {
        if ( ON::continuity::C0_locus_continuous == desired_continuity )
        {
          return true;
        }
        bIsClosed = true;
      }

      t0 = domain[0];
      t1 = domain[1];
    }
    break;

  case ON::continuity::unknown_continuity:
  case ON::continuity::C0_continuous:
  case ON::continuity::C1_continuous:
  case ON::continuity::C2_continuous:
  case ON::continuity::G1_continuous:
  case ON::continuity::G2_continuous:
  case ON::continuity::Cinfinity_continuous:
  case ON::continuity::Gsmooth_continuous:
  default:
    // does not change pre 20 March behavior - just skips the out
    // of domain evaluation on parametric queries.
    if ( t <= domain[0] || t >= domain[1] )
      return true;
    break;
  }

  // at this point, no difference between parametric and locus tests.
  desired_continuity = ON::ParametricContinuity((int)desired_continuity);


  // this is slow and uses evaluation
  // virtual overrides on curve classes that can have multiple spans
  // are much faster because the avoid evaluation
  switch ( desired_continuity )
  {
  case ON::continuity::unknown_continuity:
    break;

  case ON::continuity::C0_continuous:  
    if ( !EvPoint( t1, Pm, -1, hint ) )
      return false;
    if ( !EvPoint( t0, Pp,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) )
      return false;
    break;

  case ON::continuity::C1_continuous:
    if ( !Ev1Der( t1, Pm, D1m, -1, hint ) )
      return false;
    if ( !Ev1Der( t0, Pp, D1p,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || !(D1m-D1p).IsTiny(d1_tolerance) )
      return false;
    break;

  case ON::continuity::G1_continuous:
    if ( !EvTangent( t1, Pm, Tm, -1, hint ) )
      return false;
    if ( !EvTangent( t0, Pp, Tp,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || Tm*Tp < cos_angle_tolerance )
      return false;
    break;

  case ON::continuity::C2_continuous:
    if ( !Ev2Der( t1, Pm, D1m, D2m, -1, hint ) )
      return false;
    if ( !Ev2Der( t0, Pp, D1p, D2p,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || !(D1m-D1p).IsTiny(d1_tolerance) || !(D2m-D2p).IsTiny(d2_tolerance) )
      return false;
    break;

  case ON::continuity::G2_continuous:
  case ON::continuity::Gsmooth_continuous:
    if ( !EvCurvature( t1, Pm, Tm, Km, -1, hint ) )
      return false;
    if ( !EvCurvature( t0, Pp, Tp, Kp,  1, hint ) )
      return false;
    if ( !bIsClosed && !(Pm-Pp).IsTiny(point_tolerance) )
      return false;
    if ( Tm*Tp < cos_angle_tolerance )
      return false; // tangent discontinuity

    if ( desired_continuity == ON::continuity::Gsmooth_continuous )
    {
      if ( !ON_IsGsmoothCurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance) )
        return false;
    }
    else
    {
      if ( !ON_IsG2CurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance) )
        return false;
    }
    break;

  case ON::continuity::C0_locus_continuous:
  case ON::continuity::C1_locus_continuous:
  case ON::continuity::C2_locus_continuous:
  case ON::continuity::G1_locus_continuous:
  case ON::continuity::G2_locus_continuous:
  case ON::continuity::Cinfinity_continuous:
    break;
  }

  return true;
}